

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yy_qw(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yypos836;
  int yythunkpos836;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar4 = yymatchString(G,"<<");
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yy_qw_list(G);
    if (iVar4 != 0) {
      do {
        iVar4 = G->pos;
        iVar3 = G->thunkpos;
        iVar5 = yy_ws(G);
      } while (iVar5 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar4 = yymatchString(G,">>");
      if (iVar4 != 0) {
        return 1;
      }
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchChar(G,0x3c);
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yy_qw_list(G);
    if (iVar4 != 0) {
      do {
        iVar4 = G->pos;
        iVar3 = G->thunkpos;
        iVar5 = yy_ws(G);
      } while (iVar5 != 0);
      G->pos = iVar4;
      G->thunkpos = iVar3;
      iVar4 = yymatchChar(G,0x3e);
      if (iVar4 != 0) {
        return 1;
      }
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar4 = yymatchChar(G,0x3c);
  if (iVar4 != 0) {
    do {
      iVar4 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yy_ws(G);
    } while (iVar5 != 0);
    G->pos = iVar4;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,0x3e);
    if (iVar4 != 0) {
      yyDo(G,yy_1_qw,G->begin,G->end,"yy_1_qw");
      return 1;
    }
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_qw(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "qw"));

  {  int yypos836= G->pos, yythunkpos836= G->thunkpos;  if (!yymatchString(G, "<<")) goto l837;
  if (!yy__(G))  goto l837;
  if (!yy_qw_list(G))  goto l837;
  if (!yy__(G))  goto l837;
  if (!yymatchString(G, ">>")) goto l837;
  goto l836;
  l837:;	  G->pos= yypos836; G->thunkpos= yythunkpos836;  if (!yymatchChar(G, '<')) goto l838;
  if (!yy__(G))  goto l838;
  if (!yy_qw_list(G))  goto l838;
  if (!yy__(G))  goto l838;
  if (!yymatchChar(G, '>')) goto l838;
  goto l836;
  l838:;	  G->pos= yypos836; G->thunkpos= yythunkpos836;  if (!yymatchChar(G, '<')) goto l835;
  if (!yy__(G))  goto l835;
  if (!yymatchChar(G, '>')) goto l835;
  yyDo(G, yy_1_qw, G->begin, G->end, "yy_1_qw");

  }
  l836:;	  yyprintf((stderr, "  ok   qw"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l835:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "qw"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}